

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenuPrivate::hideMenu(QMenuPrivate *this,QMenu *menu)

{
  QAction **lhs;
  QAction *act;
  Data *pDVar1;
  bool bVar2;
  int iVar3;
  QStyle *pQVar4;
  QObject *pQVar5;
  long in_FS_OFFSET;
  undefined1 *local_78;
  undefined1 *puStack_70;
  QWeakPointer<QObject> local_68;
  undefined1 local_58 [16];
  QMenu *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (menu == (QMenu *)0x0) goto LAB_00420207;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  QPointer<QMenu>::QPointer<void>((QPointer<QMenu> *)&local_68,menu);
  QObject::blockSignals(SUB81(menu,0));
  this->field_0x421 = this->field_0x421 | 1;
  pQVar4 = QWidget::style(&menu->super_QWidget);
  if ((local_68.d == (Data *)0x0) || (pQVar5 = local_68.value, *(int *)(local_68.d + 4) == 0)) {
    pQVar5 = (QObject *)0x0;
  }
  iVar3 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x51,0,pQVar5,0);
  if ((iVar3 == 0) || (this->currentAction == (QAction *)0x0)) {
LAB_0042017c:
    this->field_0x421 = this->field_0x421 & 0xfe;
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)&local_68);
    if (bVar2) {
      QObject::blockSignals(SUB81(menu,0));
      pDVar1 = (this->activeMenu).wp.d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar5 = (QObject *)0x0;
      }
      else {
        pQVar5 = (this->activeMenu).wp.value;
      }
      if (pQVar5 == (QObject *)menu) {
        QWeakPointer<QObject>::assign<QObject>(&(this->activeMenu).wp,(QObject *)0x0);
      }
      iVar3 = 0;
      QWeakPointer<QObject>::assign<QObject>
                ((QWeakPointer<QObject> *)(*(long *)&(menu->super_QWidget).field_0x8 + 0x308),
                 (QObject *)0x0);
      QWidget::close(&menu->super_QWidget,iVar3);
      QWeakPointer<QObject>::assign<QObject>
                ((QWeakPointer<QObject> *)(*(long *)&(menu->super_QWidget).field_0x8 + 0x2f8),
                 (QObject *)0x0);
    }
  }
  else {
    lhs = &this->currentAction;
    bVar2 = ::operator==(lhs,&this->actionAboutToTrigger);
    if (!bVar2) goto LAB_0042017c;
    QWidget::actions((QList<QAction_*> *)local_58,&menu->super_QWidget);
    bVar2 = QListSpecialMethodsBase<QAction*>::contains<QAction*>
                      ((QListSpecialMethodsBase<QAction*> *)local_58,lhs);
    QArrayDataPointer<QAction_*>::~QArrayDataPointer((QArrayDataPointer<QAction_*> *)local_58);
    if (!bVar2) goto LAB_0042017c;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QEventLoop::QEventLoop((QEventLoop *)&local_78,(QObject *)0x0);
    act = *lhs;
    QMenu::setActiveAction(menu,(QAction *)0x0);
    local_48 = (QMenu *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QObject::QObject((QObject *)local_58,(QObject *)0x0);
    local_58._0_8_ = &PTR_metaObject_007d14e8;
    puStack_40 = (undefined1 *)((ulong)puStack_40 & 0xffffffffffffff00);
    local_48 = menu;
    QObject::installEventFilter((QObject *)menu);
    QTimer::singleShot((nanoseconds)0x3938700,(QObject *)&local_78,"1quit()");
    QEventLoop::exec(&local_78,0);
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)&local_68);
    if (bVar2) {
      QMenu::setActiveAction(menu,act);
      QTimer::singleShot((nanoseconds)0x1312d00,(QObject *)&local_78,"1quit()");
      QEventLoop::exec(&local_78,0);
      hideMenu::Reposter::~Reposter((Reposter *)local_58);
      QEventLoop::~QEventLoop((QEventLoop *)&local_78);
      goto LAB_0042017c;
    }
    hideMenu::Reposter::~Reposter((Reposter *)local_58);
    QEventLoop::~QEventLoop((QEventLoop *)&local_78);
  }
  QWeakPointer<QObject>::~QWeakPointer(&local_68);
LAB_00420207:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuPrivate::hideMenu(QMenu *menu)
{
    if (!menu)
        return;

    // See two execs below. They may trigger an akward situation
    // when 'menu' (also known as 'q' or 'this' in the many functions
    // around) to become a dangling pointer if the loop manages
    // to execute 'deferred delete' ... posted while executing
    // this same loop. Not good!
    struct Reposter : QObject
    {
        Reposter(QMenu *menu) : q(menu)
        {
            Q_ASSERT(q);
            q->installEventFilter(this);
        }
        ~Reposter()
        {
            if (deleteLater)
                q->deleteLater();
        }
        bool eventFilter(QObject *obj, QEvent *event) override
        {
            if (obj == q && event->type() == QEvent::DeferredDelete)
                return deleteLater = true;

            return QObject::eventFilter(obj, event);
        }
        QMenu *q = nullptr;
        bool deleteLater = false;
    };

#if QT_CONFIG(effects)
    // If deleteLater has been called and the event loop spins, while waiting
    // for visual effects to happen, menu might become stale.
    // To prevent a QSignalBlocker from restoring a stale object, block and restore signals manually.
    QPointer<QMenu> stillAlive(menu);
    const bool signalsBlocked = menu->signalsBlocked();
    menu->blockSignals(true);

    aboutToHide = true;
    // Flash item which is about to trigger (if any).
    if (menu && menu->style()->styleHint(QStyle::SH_Menu_FlashTriggeredItem, nullptr, stillAlive)
        && currentAction && currentAction == actionAboutToTrigger
        && menu->actions().contains(currentAction)) {
        QEventLoop eventLoop;
        QAction *activeAction = currentAction;

        menu->setActiveAction(nullptr);
        const Reposter deleteDeleteLate(menu);
        QTimer::singleShot(60, &eventLoop, SLOT(quit()));
        eventLoop.exec();

        if (!stillAlive)
            return;

        // Select and wait 20 ms.
        menu->setActiveAction(activeAction);
        QTimer::singleShot(20, &eventLoop, SLOT(quit()));
        eventLoop.exec();
    }

    aboutToHide = false;

    if (stillAlive)
        menu->blockSignals(signalsBlocked);
    else
        return;

#endif // QT_CONFIG(effects)
    if (activeMenu == menu)
        activeMenu = nullptr;

    menu->d_func()->causedPopup.action = nullptr;
    menu->close();
    menu->d_func()->causedPopup.widget = nullptr;
}